

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

void __thiscall duckdb::Serializer::WriteValue<double>(Serializer *this,vector<double,_true> *vec)

{
  bool bVar1;
  reference pdVar2;
  vector<double,_std::allocator<double>_> *in_RSI;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *in_RDI;
  double *item;
  const_iterator __end0;
  const_iterator __begin0;
  vector<double,_true> *__range2;
  size_type count;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_28;
  vector<double,_std::allocator<double>_> *local_20;
  size_type local_18;
  vector<double,_std::allocator<double>_> *local_10;
  
  local_10 = in_RSI;
  local_18 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
  (*(code *)in_RDI->_M_current[8])(in_RDI,local_18);
  local_20 = local_10;
  local_28._M_current =
       (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffffb8);
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    pdVar2 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_28);
    (*(code *)in_RDI->_M_current[0x1a])(*pdVar2);
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_28);
  }
  (*(code *)in_RDI->_M_current[9])();
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}